

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O1

void __thiscall testing::internal::MutexBase::Lock(MutexBase *this)

{
  int iVar1;
  pthread_t pVar2;
  GTestLog local_1c;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 != 0) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/googletest-release-1.8.0/googletest/include/gtest/internal/gtest-port.h"
                       ,0x788);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"pthread_mutex_lock(&mutex_)",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"failed with error ",0x12);
    std::ostream::operator<<(&std::cerr,iVar1);
    GTestLog::~GTestLog(&local_1c);
  }
  pVar2 = pthread_self();
  this->owner_ = pVar2;
  this->has_owner_ = true;
  return;
}

Assistant:

void Lock() {
    GTEST_CHECK_POSIX_SUCCESS_(pthread_mutex_lock(&mutex_));
    owner_ = pthread_self();
    has_owner_ = true;
  }